

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
Parser::parseCommandSequence(Parser *this,char indicator,initializer_list<const_char_*> terminators)

{
  unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *this_00;
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  Token *this_01;
  Identifier *this_02;
  pointer pCVar5;
  size_type sVar6;
  const_iterator ppcVar7;
  ulong uVar8;
  Parser *args;
  undefined7 in_register_00000031;
  Parser *this_03;
  bool local_fc;
  char *terminator;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<const_char_*> *__range2;
  string expected;
  undefined1 local_78 [8];
  unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> cmd;
  bool foundSomething;
  Identifier *identifier;
  Token *next;
  bool foundTermination;
  __single_object sequence;
  char indicator_local;
  Parser *this_local;
  initializer_list<const_char_*> terminators_local;
  
  this_03 = (Parser *)CONCAT71(in_register_00000031,indicator);
  args = (Parser *)terminators._M_len;
  sequence._M_t.super___uniq_ptr_impl<CommandSequence,_std::default_delete<CommandSequence>_>._M_t.
  super__Tuple_impl<0UL,_CommandSequence_*,_std::default_delete<CommandSequence>_>.
  super__Head_base<0UL,_CommandSequence_*,_false>._M_head_impl._7_1_ = (char)terminators._M_array;
  this_local = args;
  terminators_local._M_len = (size_type)this;
  std::make_unique<CommandSequence>();
  bVar2 = false;
LAB_00181719:
  do {
    bVar3 = atEnd(this_03);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
LAB_001819e4:
      if ((!bVar2) &&
         (sVar6 = std::initializer_list<const_char_*>::size
                            ((initializer_list<const_char_*> *)&this_local), sVar6 != 0)) {
        std::__cxx11::string::string((string *)&__range2);
        __end2 = std::initializer_list<const_char_*>::begin
                           ((initializer_list<const_char_*> *)&this_local);
        ppcVar7 = std::initializer_list<const_char_*>::end
                            ((initializer_list<const_char_*> *)&this_local);
        for (; __end2 != ppcVar7; __end2 = __end2 + 1) {
          pcVar1 = *__end2;
          uVar8 = std::__cxx11::string::empty();
          if ((uVar8 & 1) == 0) {
            std::__cxx11::string::operator+=((string *)&__range2,", ");
          }
          std::__cxx11::string::operator+=((string *)&__range2,pcVar1);
        }
        Logger::printError<std::__cxx11::string>
                  ((Logger *)0x1,0x221f9d,(char *)&__range2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        std::__cxx11::string::~string((string *)&__range2);
      }
      std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
      unique_ptr<CommandSequence,std::default_delete<CommandSequence>,void>
                ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)this,
                 (unique_ptr<CommandSequence,_std::default_delete<CommandSequence>_> *)
                 &stack0xffffffffffffffc8);
      std::unique_ptr<CommandSequence,_std::default_delete<CommandSequence>_>::~unique_ptr
                ((unique_ptr<CommandSequence,_std::default_delete<CommandSequence>_> *)
                 &stack0xffffffffffffffc8);
      return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>
             )(__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>
               )this;
    }
    this_01 = peekToken(this_03,0);
    if (this_01->type != Separator) {
      if (this_01->type == Identifier) {
        this_02 = Token::identifierValue(this_01);
        bVar3 = Identifier::startsWith
                          (this_02,sequence._M_t.
                                   super___uniq_ptr_impl<CommandSequence,_std::default_delete<CommandSequence>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_CommandSequence_*,_std::default_delete<CommandSequence>_>
                                   .super__Head_base<0UL,_CommandSequence_*,_false>._M_head_impl.
                                   _7_1_);
        if ((bVar3) &&
           (bVar3 = isPartOfList(this_02,(initializer_list<const_char_*> *)&this_local), bVar3)) {
          bVar2 = true;
          goto LAB_001819e4;
        }
      }
      bVar3 = false;
      while( true ) {
        bVar4 = checkEquLabel(this_03);
        args = (Parser *)CONCAT71((int7)((ulong)args >> 8),bVar4);
        local_fc = true;
        if (!bVar4) {
          bVar4 = checkMacroDefinition(this_03);
          args = (Parser *)CONCAT71((int7)((ulong)args >> 8),bVar4);
          local_fc = true;
          if (!bVar4) {
            local_fc = checkExpFuncDefinition(this_03);
          }
        }
        if (local_fc == false) break;
        bVar3 = hasError(this_03);
        if (bVar3) {
          pCVar5 = std::unique_ptr<CommandSequence,_std::default_delete<CommandSequence>_>::
                   operator->((unique_ptr<CommandSequence,_std::default_delete<CommandSequence>_> *)
                              &stack0xffffffffffffffc8);
          handleError((Parser *)&cmd);
          CommandSequence::addCommand(pCVar5,&cmd);
          std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::~unique_ptr
                    (&cmd);
        }
        bVar3 = true;
      }
      if (!bVar3) {
        parseCommand((Parser *)local_78);
        bVar3 = isInsideTrueBlock(this_03);
        if (bVar3) {
          pCVar5 = std::unique_ptr<CommandSequence,_std::default_delete<CommandSequence>_>::
                   operator->((unique_ptr<CommandSequence,_std::default_delete<CommandSequence>_> *)
                              &stack0xffffffffffffffc8);
          this_00 = (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)
                    ((long)&expected.field_2 + 8);
          std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::unique_ptr
                    (this_00,(unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
                              *)local_78);
          CommandSequence::addCommand(pCVar5,this_00);
          std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::~unique_ptr
                    ((unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)
                     ((long)&expected.field_2 + 8));
        }
        std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::~unique_ptr
                  ((unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)
                   local_78);
      }
      goto LAB_00181719;
    }
    eatToken(this_03);
  } while( true );
}

Assistant:

std::unique_ptr<CAssemblerCommand> Parser::parseCommandSequence(char indicator, const std::initializer_list<const char*> terminators)
{
	auto sequence = std::make_unique<CommandSequence>();

	bool foundTermination = false;
	while (!atEnd())
	{
		const Token &next = peekToken();

		if(next.type == TokenType::Separator)
		{
			eatToken();
			continue;
		}

		if (next.type == TokenType::Identifier)
		{
			const auto &identifier = next.identifierValue();
			if (identifier.startsWith(indicator) && isPartOfList(identifier, terminators))
			{
				foundTermination = true;
				break;
			}
		}

		bool foundSomething = false;
		while (checkEquLabel() || checkMacroDefinition() || checkExpFuncDefinition())
		{
			// do nothing, just parse all the equs and macros there are
			if (hasError())
				sequence->addCommand(handleError());

			foundSomething = true;
		}

		if (foundSomething)
			continue;

		std::unique_ptr<CAssemblerCommand> cmd = parseCommand();

		// omit commands inside blocks that are trivially false
		if (!isInsideTrueBlock())
		{
			continue;
		}

		sequence->addCommand(std::move(cmd));
	}

	if (!foundTermination && terminators.size())
	{
		std::string expected;
		for (const char* terminator : terminators)
		{
			if (!expected.empty())
				expected += ", ";
			expected += terminator;
		}

		Logger::printError(Logger::Error, "Unterminated command sequence, expected any of %s.", expected);
	}

	return sequence;
}